

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  size_type *this_00;
  _Base_ptr *this_01;
  _Base_ptr p_Var3;
  pointer ppVar4;
  pointer ppVar5;
  detail *pdVar6;
  anon_class_16_2_62572841 content;
  Server *this_02;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  const_iterator cVar11;
  iterator __position;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  Request *pRVar14;
  undefined1 *puVar15;
  _Base_ptr p_Var16;
  char *pcVar17;
  char cVar18;
  detail *pdVar19;
  Response *pRVar20;
  string length;
  string content_type;
  string boundary;
  char *pcVar21;
  _Alloc_hider _Var22;
  _Alloc_hider __first;
  undefined1 auStack_f0 [24];
  _Rb_tree_node_base *local_d8;
  size_t local_d0;
  Request *local_c8;
  Stream *local_c0;
  Request *local_b8;
  _Base_ptr local_b0;
  string local_a8;
  _Base_ptr local_88;
  Request *pRStack_80;
  Request *local_78 [2];
  _Base_ptr local_68;
  Server *local_60;
  undefined1 local_58 [40];
  
  iVar9 = res->status;
  local_c0 = strm;
  if (iVar9 == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h"
                  ,0xb79,
                  "bool httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  pRVar20 = res;
  if ((399 < iVar9) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    iVar9 = res->status;
  }
  switch(iVar9) {
  case 400:
    break;
  case 0x191:
    break;
  case 0x192:
  case 0x195:
  case 0x196:
  case 0x197:
  case 0x198:
  case 0x199:
  case 0x19a:
  case 0x19b:
  case 0x19c:
switchD_001217fc_caseD_192:
    break;
  case 0x193:
    break;
  case 0x194:
    break;
  case 0x19d:
    break;
  case 0x19e:
    break;
  case 0x19f:
    break;
  case 0x1a0:
    break;
  default:
    switch(iVar9) {
    case 200:
      break;
    case 0xc9:
    case 0xcb:
    case 0xcd:
      goto switchD_001217fc_caseD_192;
    case 0xca:
      break;
    case 0xcc:
      break;
    case 0xce:
      break;
    default:
      switch(iVar9) {
      case 0x12d:
        break;
      case 0x12e:
        break;
      case 0x12f:
        break;
      case 0x130:
        break;
      default:
        goto switchD_001217fc_caseD_192;
      }
    }
  }
  iVar9 = Stream::write_format<int,char_const*>
                    (local_c0,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&stack0xffffffffffffff08);
  if (iVar9 == 0) {
    return false;
  }
  local_c8 = req;
  local_b8 = (Request *)res;
  local_60 = this;
  if (last_connection) {
    local_a8._M_dataplus._M_p = "close";
LAB_00121aba:
    pRVar14 = local_c8;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&(((Request *)res)->path)._M_string_length,(char **)&stack0xffffffffffffff08,
               (char **)&local_a8);
  }
  else {
    _Var22._M_p = auStack_f0 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff08,"Connection","");
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(req->headers)._M_t,(key_type *)&stack0xffffffffffffff08);
    if (_Var22._M_p != auStack_f0 + 8) {
      operator_delete(_Var22._M_p,auStack_f0._8_8_ + 1);
    }
    p_Var1 = &(local_c8->headers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)(cVar11._M_node + 2);
    }
    std::__cxx11::string::string((string *)&stack0xffffffffffffff08,pcVar21,(allocator *)&local_a8);
    iVar9 = std::__cxx11::string::compare((char *)&stack0xffffffffffffff08);
    if (_Var22._M_p != auStack_f0 + 8) {
      operator_delete(_Var22._M_p,auStack_f0._8_8_ + 1);
    }
    if (iVar9 == 0) {
      local_a8._M_dataplus._M_p = "close";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&(local_b8->path)._M_string_length,(char **)&stack0xffffffffffffff08,
                 (char **)&local_a8);
    }
    pcVar21 = auStack_f0 + 8;
    _Var22._M_p = pcVar21;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff08,"Connection","");
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(req->headers)._M_t,(key_type *)&stack0xffffffffffffff08);
    if (_Var22._M_p != pcVar21) {
      operator_delete(_Var22._M_p,auStack_f0._8_8_ + 1);
    }
    res = (Response *)local_b8;
    if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)(cVar11._M_node + 2);
    }
    std::__cxx11::string::string((string *)&stack0xffffffffffffff08,pcVar17,(allocator *)&local_a8);
    iVar9 = std::__cxx11::string::compare((char *)&stack0xffffffffffffff08);
    if (_Var22._M_p != pcVar21) {
      operator_delete(_Var22._M_p,auStack_f0._8_8_ + 1);
    }
    pRVar14 = local_c8;
    if (iVar9 == 0) {
      local_a8._M_dataplus._M_p = "Keep-Alive";
      goto LAB_00121aba;
    }
  }
  this_00 = &(((Request *)res)->path)._M_string_length;
  _Var22._M_p = auStack_f0 + 8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff08,"Content-Type","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this_00,(key_type *)&stack0xffffffffffffff08);
  if (_Var22._M_p != auStack_f0 + 8) {
    operator_delete(_Var22._M_p,auStack_f0._8_8_ + 1);
  }
  local_b0 = (_Base_ptr)&(((Request *)res)->path).field_2;
  if (cVar11._M_node == local_b0) {
    local_a8._M_dataplus._M_p = "text/plain";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)&stack0xffffffffffffff08,(char **)&local_a8);
  }
  pcVar21 = (char *)(auStack_f0 + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff08,"Accept-Ranges","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this_00,(key_type *)&stack0xffffffffffffff08);
  if ((Response *)pcVar21 != (Response *)(auStack_f0 + 8)) {
    operator_delete(pcVar21,auStack_f0._8_8_ + 1);
  }
  if (cVar11._M_node == local_b0) {
    pcVar21 = "Accept-Ranges";
    local_a8._M_dataplus._M_p = "bytes";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)&stack0xffffffffffffff08,(char **)&local_a8);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = 0;
  local_58[0x10] = '\0';
  if (0x10 < (ulong)((long)(pRVar14->ranges).
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pRVar14->ranges).
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=((string *)local_58,(string *)&stack0xffffffffffffff08);
    if ((Response *)pcVar21 != (Response *)(auStack_f0 + 8)) {
      operator_delete(pcVar21,auStack_f0._8_8_ + 1);
    }
    pcVar21 = auStack_f0 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff08,"Content-Type","");
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this_00,(key_type *)&stack0xffffffffffffff08);
    if ((Response *)pcVar21 != (Response *)(auStack_f0 + 8)) {
      operator_delete(pcVar21,auStack_f0._8_8_ + 1);
    }
    if (__position._M_node != local_b0) {
      std::__cxx11::string::_M_assign((string *)&local_a8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this_00,(const_iterator)__position._M_node);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff08,"multipart/byteranges; boundary=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[13],std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char (*) [13])"Content-Type",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff08);
    if ((Response *)pcVar21 != (Response *)(auStack_f0 + 8)) {
      operator_delete(pcVar21,auStack_f0._8_8_ + 1);
    }
  }
  this_01 = &(((Request *)res)->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = (((Request *)res)->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  local_58._32_8_ = this_01;
  if (p_Var3 == (_Base_ptr)0x0) {
    _Var22._M_p = (pointer)(((Request *)res)->body)._M_string_length;
    if (_Var22._M_p != (char *)0x0) {
      ppVar4 = (pRVar14->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (pRVar14->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar4 != ppVar5) {
        if ((long)ppVar5 - (long)ppVar4 == 0x10) {
          pdVar6 = (detail *)ppVar4->first;
          pcVar17 = (char *)ppVar4->second;
          if (((ulong)pdVar6 & (ulong)pcVar17) == 0xffffffffffffffff) {
            pdVar19 = (detail *)0x0;
            pcVar17 = _Var22._M_p;
          }
          else {
            pdVar19 = (detail *)(_Var22._M_p + -(long)pcVar17);
            if (pdVar6 != (detail *)0xffffffffffffffff) {
              pdVar19 = pdVar6;
            }
            if (pdVar6 == (detail *)0xffffffffffffffff) {
              pcVar17 = _Var22._M_p + -1;
            }
            if (pcVar17 == (char *)0xffffffffffffffff) {
              pcVar17 = _Var22._M_p + -1;
            }
            pcVar17 = pcVar17 + (1 - (long)pdVar19);
          }
          detail::make_content_range_header_field_abi_cxx11_
                    ((string *)&stack0xffffffffffffff08,pdVar19,(size_t)pcVar17,(size_t)_Var22._M_p,
                     (size_t)pRVar20);
          local_88 = (_Base_ptr)0x138743;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,(char **)&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff08);
          _Var22._M_p = pcVar17;
          if ((Response *)pcVar21 != (Response *)(auStack_f0 + 8)) {
            operator_delete(pcVar21,auStack_f0._8_8_ + 1);
          }
        }
        else {
          _Var22._M_p = (char *)0x0;
          detail::
          process_multipart_ranges_data<httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                    (pRVar14,res,(string *)local_58,&local_a8,
                     (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff08,
                     (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff08,
                     (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff08);
        }
      }
      __first._M_p = auStack_f0 + 8;
      cVar18 = '\x01';
      if ((char *)0x9 < _Var22._M_p) {
        pcVar21 = _Var22._M_p;
        cVar7 = '\x04';
        do {
          cVar18 = cVar7;
          if (pcVar21 < (char *)0x64) {
            cVar18 = cVar18 + -2;
            goto LAB_001220ec;
          }
          if (pcVar21 < (char *)0x3e8) {
            cVar18 = cVar18 + -1;
            goto LAB_001220ec;
          }
          if (pcVar21 < (char *)0x2710) goto LAB_001220ec;
          bVar8 = (char *)0x1869f < pcVar21;
          pcVar21 = (char *)((ulong)pcVar21 / 10000);
          cVar7 = cVar18 + '\x04';
        } while (bVar8);
        cVar18 = cVar18 + '\x01';
      }
LAB_001220ec:
      std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff08,cVar18);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (__first._M_p,auStack_f0._0_4_,(unsigned_long)_Var22._M_p);
      local_88 = (_Base_ptr)0x137a24;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char **)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff08);
      goto LAB_0012212e;
    }
    if ((((Request *)res)->version)._M_dataplus._M_p == (pointer)0x0) {
      local_88 = (_Base_ptr)0x13bddf;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char **)&stack0xffffffffffffff08,(char **)&local_88);
    }
    else {
      local_88 = (_Base_ptr)0x1384ec;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char **)&stack0xffffffffffffff08,(char **)&local_88);
    }
  }
  else {
    ppVar4 = (pRVar14->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pRVar14->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar4 != ppVar5) {
      if ((long)ppVar5 - (long)ppVar4 == 0x10) {
        pdVar6 = (detail *)ppVar4->first;
        puVar15 = (undefined1 *)ppVar4->second;
        if (((ulong)pdVar6 & (ulong)puVar15) == 0xffffffffffffffff) {
          pdVar19 = (detail *)0x0;
          p_Var16 = p_Var3;
        }
        else {
          pdVar19 = (detail *)((long)p_Var3 - (long)puVar15);
          if (pdVar6 != (detail *)0xffffffffffffffff) {
            pdVar19 = pdVar6;
          }
          puVar2 = (undefined1 *)((long)&p_Var3[-1]._M_right + 7);
          if (pdVar6 == (detail *)0xffffffffffffffff) {
            puVar15 = puVar2;
          }
          if (puVar15 == (undefined1 *)0xffffffffffffffff) {
            puVar15 = puVar2;
          }
          p_Var16 = (_Base_ptr)(puVar15 + (1 - (long)pdVar19));
        }
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)&stack0xffffffffffffff08,pdVar19,(size_t)p_Var16,(size_t)p_Var3,
                   (size_t)pRVar20);
        local_88 = (_Base_ptr)0x138743;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this_00,(char **)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff08);
        std::__cxx11::string::substr((ulong)&local_88,(ulong)this_01);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_88);
        if (local_88 != (_Base_ptr)local_78) {
          operator_delete(local_88,(long)local_78[0] + 1);
        }
        if ((Response *)pcVar21 != (Response *)(auStack_f0 + 8)) {
LAB_00121df8:
          operator_delete(pcVar21,auStack_f0._8_8_ + 1);
        }
      }
      else {
        pRVar20 = (Response *)(auStack_f0 + 8);
        auStack_f0._0_8_ = 0;
        auStack_f0._8_8_ = auStack_f0._8_8_ & 0xffffffffffffff00;
        local_88 = (_Base_ptr)&stack0xffffffffffffff08;
        content.res = pRVar20;
        content.data = &res->version;
        pcVar21 = (char *)pRVar20;
        pRStack_80 = (Request *)res;
        detail::
        process_multipart_ranges_data<httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                  ((detail *)pRVar14,(Request *)res,(Response *)local_58,&local_a8,
                   (string *)local_88,(anon_class_8_1_898a9ca8)local_88,
                   (anon_class_8_1_898a9ca8)local_88,content);
        std::__cxx11::string::operator=((string *)this_01,(string *)&stack0xffffffffffffff08);
        if ((Response *)pcVar21 != pRVar20) goto LAB_00121df8;
      }
    }
    p_Var3 = (((Request *)res)->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    cVar18 = '\x01';
    __first._M_p = auStack_f0 + 8;
    if ((_Base_ptr)0x9 < p_Var3) {
      p_Var16 = p_Var3;
      cVar7 = '\x04';
      do {
        cVar18 = cVar7;
        if (p_Var16 < (_Base_ptr)0x64) {
          cVar18 = cVar18 + -2;
          goto LAB_00121f75;
        }
        if (p_Var16 < (_Base_ptr)0x3e8) {
          cVar18 = cVar18 + -1;
          goto LAB_00121f75;
        }
        if (p_Var16 < (_Base_ptr)0x2710) goto LAB_00121f75;
        bVar8 = (_Base_ptr)0x1869f < p_Var16;
        p_Var16 = (_Base_ptr)((ulong)p_Var16 / 10000);
        cVar7 = cVar18 + '\x04';
      } while (bVar8);
      cVar18 = cVar18 + '\x01';
    }
LAB_00121f75:
    std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff08,cVar18);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (__first._M_p,auStack_f0._0_4_,(unsigned_long)p_Var3);
    local_88 = (_Base_ptr)0x137a24;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff08);
LAB_0012212e:
    if (__first._M_p != auStack_f0 + 8) {
      operator_delete(__first._M_p,auStack_f0._8_8_ + 1);
    }
  }
  auStack_f0._0_8_ = 0;
  iVar9 = 0;
  auStack_f0._8_8_ = 0;
  local_d0 = 0;
  p_Var12 = *(_Base_ptr *)&(local_b8->headers)._M_t._M_impl;
  auStack_f0._16_8_ = (_Rb_tree_node_base *)auStack_f0;
  local_d8 = (_Rb_tree_node_base *)auStack_f0;
  if (p_Var12 != local_b0) {
    iVar9 = 0;
    do {
      local_88 = *(_Base_ptr *)(p_Var12 + 1);
      local_68 = *(_Base_ptr *)(p_Var12 + 2);
      iVar10 = Stream::write_format<char_const*,char_const*>
                         (local_c0,"%s: %s\r\n",(char **)&local_88,
                          (char **)&((_Rb_tree_node_base *)local_78)->_M_left);
      if (iVar10 < 0) goto LAB_0012227b;
      iVar9 = iVar9 + iVar10;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != local_b0);
    if ((_Rb_tree_node_base *)auStack_f0._16_8_ != (_Rb_tree_node_base *)auStack_f0) {
      p_Var13 = (_Rb_tree_node_base *)auStack_f0._16_8_;
      do {
        local_88 = *(_Base_ptr *)(p_Var13 + 1);
        local_68 = *(_Base_ptr *)(p_Var13 + 2);
        iVar10 = Stream::write_format<char_const*,char_const*>
                           (local_c0,"%s: %s\r\n",(char **)&local_88,
                            (char **)&((_Rb_tree_node_base *)local_78)->_M_left);
        if (iVar10 < 0) goto LAB_0012227b;
        iVar9 = iVar9 + iVar10;
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != (_Rb_tree_node_base *)auStack_f0);
    }
  }
  iVar10 = (*local_c0->_vptr_Stream[4])(local_c0,"\r\n");
  pRVar14 = local_c8;
  bVar8 = false;
  if (iVar10 < 0) {
    iVar9 = 0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xffffffffffffff08);
  if (iVar9 == 0 && iVar10 == 0) goto LAB_00122321;
LAB_00122292:
  this_02 = local_60;
  iVar9 = std::__cxx11::string::compare((char *)pRVar14);
  pRVar14 = local_b8;
  if (iVar9 != 0) {
    if ((local_b8->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
    {
      if (((local_b8->version)._M_dataplus._M_p != (pointer)0x0) &&
         (bVar8 = write_content_with_provider
                            (this_02,local_c0,local_c8,(Response *)local_b8,(string *)local_58,
                             &local_a8), !bVar8)) goto LAB_0012231f;
    }
    else {
      iVar9 = (*local_c0->_vptr_Stream[5])(local_c0,local_58._32_8_);
      if (iVar9 == 0) {
LAB_0012231f:
        bVar8 = false;
        goto LAB_00122321;
      }
    }
  }
  bVar8 = true;
  if ((this_02->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this_02->logger_)._M_invoker)((_Any_data *)&this_02->logger_,local_c8,(Response *)pRVar14);
  }
LAB_00122321:
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return bVar8;
LAB_0012227b:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xffffffffffffff08);
  pRVar14 = local_c8;
  goto LAB_00122292;
}

Assistant:

inline bool Server::write_response(Stream &strm, bool last_connection,
                                   const Request &req, Response &res) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_) { error_handler_(req, res); }

  // Response line
  if (!strm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                         detail::status_message(res.status))) {
    return false;
  }

  // Headers
  if (last_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  }

  if (!last_connection && req.get_header_value("Connection") == "Keep-Alive") {
    res.set_header("Connection", "Keep-Alive");
  }

  if (!res.has_header("Content-Type")) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Accept-Ranges")) {
    res.set_header("Accept-Ranges", "bytes");
  }

  std::string content_type;
  std::string boundary;

  if (req.ranges.size() > 1) {
    boundary = detail::make_multipart_data_boundary();

    auto it = res.headers.find("Content-Type");
    if (it != res.headers.end()) {
      content_type = it->second;
      res.headers.erase(it);
    }

    res.headers.emplace("Content-Type",
                        "multipart/byteranges; boundary=" + boundary);
  }

  if (res.body.empty()) {
    if (res.content_length > 0) {
      size_t length = 0;
      if (req.ranges.empty()) {
        length = res.content_length;
      } else if (req.ranges.size() == 1) {
        auto offsets =
            detail::get_range_offset_and_length(req, res.content_length, 0);
        auto offset = offsets.first;
        length = offsets.second;
        auto content_range = detail::make_content_range_header_field(
            offset, length, res.content_length);
        res.set_header("Content-Range", content_range);
      } else {
        length = detail::get_multipart_ranges_data_length(req, res, boundary,
                                                          content_type);
      }
      res.set_header("Content-Length", std::to_string(length));
    } else {
      if (res.content_provider) {
        res.set_header("Transfer-Encoding", "chunked");
      } else {
        res.set_header("Content-Length", "0");
      }
    }
  } else {
    if (req.ranges.empty()) {
      ;
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.body.size(), 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      auto content_range = detail::make_content_range_header_field(
          offset, length, res.body.size());
      res.set_header("Content-Range", content_range);
      res.body = res.body.substr(offset, length);
    } else {
      res.body =
          detail::make_multipart_ranges_data(req, res, boundary, content_type);
    }

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
    // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
    const auto &encodings = req.get_header_value("Accept-Encoding");
    if (encodings.find("gzip") != std::string::npos &&
        detail::can_compress(res.get_header_value("Content-Type"))) {
      if (detail::compress(res.body)) {
        res.set_header("Content-Encoding", "gzip");
      }
    }
#endif

    auto length = std::to_string(res.body.size());
    res.set_header("Content-Length", length);
  }

  if (!detail::write_headers(strm, res, Headers())) { return false; }

  // Body
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!strm.write(res.body)) { return false; }
    } else if (res.content_provider) {
      if (!write_content_with_provider(strm, req, res, boundary,
                                       content_type)) {
        return false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return true;
}